

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O2

void test_value_decimal128(void)

{
  char cVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  bson_decimal128_t dec;
  bson_t other;
  bson_value_t copy;
  bson_iter_t iter;
  undefined8 uStack_288;
  undefined1 local_210 [16];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined1 local_120 [32];
  undefined1 local_100 [232];
  
  local_190 = 0;
  uStack_188 = 0;
  local_1a0 = 0;
  uStack_198 = 0;
  local_1b0 = 0;
  uStack_1a8 = 0;
  local_1c0 = 0;
  uStack_1b8 = 0;
  local_1d0 = 0;
  uStack_1c8 = 0;
  local_1e0 = 0;
  uStack_1d8 = 0;
  local_1f0 = 0;
  uStack_1e8 = 0;
  local_200 = 0x500000003;
  uStack_1f8 = 5;
  cVar1 = bson_decimal128_from_string("123.5",local_210);
  if (cVar1 == '\0') {
    pcVar5 = "bson_decimal128_from_string (\"123.5\", &dec)";
    uStack_288 = 0x75;
  }
  else {
    uVar2 = bson_bcon_magic();
    uVar2 = bcon_new(0,"decimal128",uVar2,0x12,local_210,0);
    cVar1 = bson_iter_init(local_100,uVar2);
    if (cVar1 != '\0') {
      cVar1 = bson_iter_next(local_100);
      if (cVar1 != '\0') {
        lVar3 = bson_iter_value(local_100);
        if (lVar3 == 0) {
          pcVar5 = "(value = bson_iter_value (&iter))";
          uStack_288 = 0x78;
        }
        else {
          bson_value_copy(lVar3,local_120);
          uVar4 = bson_iter_key(local_100);
          cVar1 = bson_append_value(&local_200,uVar4,0xffffffffffffffff,local_120);
          if (cVar1 != '\0') {
            bson_value_destroy(local_120);
            bson_destroy(uVar2);
            bson_destroy(&local_200);
            return;
          }
          pcVar5 = "bson_append_value (&other, bson_iter_key (&iter), -1, &copy)";
          uStack_288 = 0x7a;
        }
        goto LAB_0012d3bd;
      }
    }
    pcVar5 = "bson_iter_init (&iter, doc) && bson_iter_next (&iter)";
    uStack_288 = 0x77;
  }
LAB_0012d3bd:
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-value.c",
          uStack_288,"test_value_decimal128",pcVar5);
  abort();
}

Assistant:

static void
test_value_decimal128 (void)
{
   const bson_value_t *value;
   bson_value_t copy;
   bson_iter_t iter;
   bson_decimal128_t dec;
   bson_t other = BSON_INITIALIZER;
   bson_t *doc;

   BSON_ASSERT (bson_decimal128_from_string ("123.5", &dec));
   doc = BCON_NEW ("decimal128", BCON_DECIMAL128 (&dec));
   BSON_ASSERT (bson_iter_init (&iter, doc) && bson_iter_next (&iter));
   BSON_ASSERT ((value = bson_iter_value (&iter)));
   bson_value_copy (value, &copy);
   BSON_ASSERT (bson_append_value (&other, bson_iter_key (&iter), -1, &copy));

   bson_value_destroy (&copy);
   bson_destroy (doc);
   bson_destroy (&other);
}